

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mythread.h
# Opt level: O0

void mythread_condtime_set(mythread_condtime *condtime,mythread_cond *cond,uint32_t timeout_ms)

{
  undefined1 local_30 [8];
  timeval now;
  uint32_t timeout_ms_local;
  mythread_cond *cond_local;
  mythread_condtime *condtime_local;
  
  condtime->tv_sec = (ulong)timeout_ms / 1000;
  condtime->tv_nsec = (ulong)((timeout_ms % 1000) * 1000000);
  now.tv_usec._4_4_ = timeout_ms;
  gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
  condtime->tv_sec = (long)local_30 + condtime->tv_sec;
  condtime->tv_nsec = now.tv_sec * 1000 + condtime->tv_nsec;
  if (999999999 < condtime->tv_nsec) {
    condtime->tv_nsec = condtime->tv_nsec + -1000000000;
    condtime->tv_sec = condtime->tv_sec + 1;
  }
  return;
}

Assistant:

static inline void
mythread_condtime_set(mythread_condtime *condtime, const mythread_cond *cond,
		uint32_t timeout_ms)
{
	condtime->tv_sec = timeout_ms / 1000;
	condtime->tv_nsec = (timeout_ms % 1000) * 1000000;

#ifdef HAVE_CLOCK_GETTIME
	struct timespec now;
	int ret = clock_gettime(cond->clk_id, &now);
	assert(ret == 0);
	(void)ret;

	condtime->tv_sec += now.tv_sec;
	condtime->tv_nsec += now.tv_nsec;
#else
	(void)cond;

	struct timeval now;
	gettimeofday(&now, NULL);

	condtime->tv_sec += now.tv_sec;
	condtime->tv_nsec += now.tv_usec * 1000L;
#endif

	// tv_nsec must stay in the range [0, 999_999_999].
	if (condtime->tv_nsec >= 1000000000L) {
		condtime->tv_nsec -= 1000000000L;
		++condtime->tv_sec;
	}
}